

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O2

bool __thiscall benchmark::JSONReporter::ReportContext(JSONReporter *this,Context *context)

{
  ostream *poVar1;
  ostream *poVar2;
  char build_type [6];
  allocator local_b9;
  string local_b8;
  string local_98;
  string indent;
  string inner_indent;
  string walltime_value;
  
  poVar2 = (this->super_BenchmarkReporter).output_stream_;
  std::operator<<(poVar2,"{\n");
  inner_indent._M_dataplus._M_p = (pointer)&inner_indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&inner_indent,'\x02');
  poVar1 = std::operator<<(poVar2,(string *)&inner_indent);
  std::operator<<(poVar1,"\"context\": {\n");
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,'\x04');
  LocalDateTimeString_abi_cxx11_();
  poVar1 = std::operator<<(poVar2,(string *)&indent);
  std::__cxx11::string::string((string *)&local_b8,"date",(allocator *)build_type);
  anon_unknown_3::FormatKV(&local_98,&local_b8,&walltime_value);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar1 = std::operator<<(poVar2,(string *)&indent);
  std::__cxx11::string::string((string *)&local_b8,"num_cpus",(allocator *)build_type);
  anon_unknown_3::FormatKV(&local_98,&local_b8,(long)context->num_cpus);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar1 = std::operator<<(poVar2,(string *)&indent);
  std::__cxx11::string::string((string *)&local_b8,"mhz_per_cpu",(allocator *)build_type);
  anon_unknown_3::FormatKV(&local_98,&local_b8,(long)(context->mhz_per_cpu + 0.5));
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar1 = std::operator<<(poVar2,(string *)&indent);
  std::__cxx11::string::string((string *)&local_b8,"cpu_scaling_enabled",(allocator *)build_type);
  anon_unknown_3::FormatKV(&local_98,&local_b8,context->cpu_scaling_enabled);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  builtin_strncpy(build_type,"debug",6);
  poVar1 = std::operator<<(poVar2,(string *)&indent);
  std::__cxx11::string::string((string *)&local_b8,"library_build_type",&local_b9);
  anon_unknown_3::FormatKV(&local_98,&local_b8,build_type);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar1 = std::operator<<(poVar2,(string *)&inner_indent);
  std::operator<<(poVar1,"},\n");
  poVar2 = std::operator<<(poVar2,(string *)&inner_indent);
  std::operator<<(poVar2,"\"benchmarks\": [\n");
  std::__cxx11::string::~string((string *)&walltime_value);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&inner_indent);
  return true;
}

Assistant:

bool JSONReporter::ReportContext(const Context& context) {
  std::ostream& out = GetOutputStream();

  out << "{\n";
  std::string inner_indent(2, ' ');

  // Open context block and print context information.
  out << inner_indent << "\"context\": {\n";
  std::string indent(4, ' ');

  std::string walltime_value = LocalDateTimeString();
  out << indent << FormatKV("date", walltime_value) << ",\n";

  out << indent
      << FormatKV("num_cpus", static_cast<int64_t>(context.num_cpus))
      << ",\n";
  out << indent
      << FormatKV("mhz_per_cpu", RoundDouble(context.mhz_per_cpu))
      << ",\n";
  out << indent
      << FormatKV("cpu_scaling_enabled", context.cpu_scaling_enabled)
      << ",\n";

#if defined(NDEBUG)
  const char build_type[] = "release";
#else
  const char build_type[] = "debug";
#endif
  out << indent << FormatKV("library_build_type", build_type) << "\n";
  // Close context block and open the list of benchmarks.
  out << inner_indent << "},\n";
  out << inner_indent << "\"benchmarks\": [\n";
  return true;
}